

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

string * __thiscall
cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *fname,char *directory,
          char *toplevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  size_t sVar9;
  size_type *psVar10;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prevDir;
  string file;
  string local_b8;
  string local_98;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  char *local_58;
  string local_50;
  
  local_58 = directory;
  std::__cxx11::string::string((string *)&local_50,(char *)this,(allocator *)&local_b8);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
  std::__cxx11::string::string((string *)&local_b8,fname,(allocator *)&local_78);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_b8);
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  paVar2 = &local_98.field_2;
  paVar1 = &__return_storage_ptr__->field_2;
  do {
    sVar5 = local_b8._M_string_length;
    if (local_b8._M_string_length == local_70) {
      if (local_b8._M_string_length == 0) goto LAB_00291fdf;
      iVar7 = bcmp(local_b8._M_dataplus._M_p,local_78,local_b8._M_string_length);
      if (iVar7 == 0) goto LAB_00291fdf;
    }
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8._M_dataplus._M_p,local_b8._M_dataplus._M_p + sVar5);
    std::__cxx11::string::append((char *)&local_98);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_50._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar10) {
      lVar4 = plVar8[3];
      paVar1->_M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar6 = cmsys::SystemTools::FileExists((__return_storage_ptr__->_M_dataplus)._M_p);
    sVar5 = local_b8._M_string_length;
    iVar7 = 1;
    if (!bVar6) {
      sVar9 = strlen(local_58);
      iVar7 = 3;
      if (sVar9 <= sVar5) {
        std::__cxx11::string::_M_assign((string *)&local_78);
        cmsys::SystemTools::GetParentDirectory(&local_98,&local_b8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 0;
      }
    }
    if ((!bVar6) &&
       (pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar3 != paVar1)) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  } while (iVar7 == 0);
  if (iVar7 == 3) {
LAB_00291fdf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(const char* fname,
  const char* directory, const char* toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while(dir != prevDir)
    {
    std::string path = dir + "/" + file;
    if ( cmSystemTools::FileExists(path.c_str()) )
      {
      return path;
      }
    if ( dir.size() < strlen(toplevel) )
      {
      break;
      }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
    }
  return "";
}